

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O1

HT_Boolean ht_task_scheduler_remove_task(HT_TaskScheduler *task_scheduler,HT_TaskId task_id)

{
  void *ptr;
  size_t sVar1;
  size_t i;
  size_t sVar2;
  
  if ((-1 < task_id) && (sVar2 = (task_scheduler->tasks).size, sVar2 != 0)) {
    sVar1 = 0;
    do {
      ptr = (task_scheduler->tasks).data[sVar1];
      if (*(int *)((long)ptr + 0x20) == task_id) {
        sVar2 = 0;
        do {
          if ((task_scheduler->tasks).data[sVar2] == ptr) {
            ht_bag_void_ptr_remove_nth(&task_scheduler->tasks,sVar2);
          }
          sVar2 = sVar2 + 1;
        } while (sVar2 < (task_scheduler->tasks).size);
        ht_free(ptr);
        return 1;
      }
      sVar1 = sVar1 + 1;
    } while (sVar2 != sVar1);
  }
  return 0;
}

Assistant:

HT_Boolean
ht_task_scheduler_remove_task(HT_TaskScheduler* task_scheduler, HT_TaskId task_id)
{
    size_t i;

    if (task_id < 0)
    {
        return HT_FALSE;
    }

    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        HT_Task* task = HT_TASK(task_scheduler->tasks.data[i]);
        if (task->id == task_id)
        {
            ht_task_scheduler_remove_task_entry(&task_scheduler->tasks, task);
            ht_free(task);
            return HT_TRUE;
        }
    }

    return HT_FALSE;
}